

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O2

AllocateResult __thiscall
capnp::_::BuilderArena::allocate(BuilderArena *this,SegmentWordCount amount)

{
  ulong uVar1;
  SegmentWordCount SVar2;
  int iVar3;
  _ *this_00;
  undefined4 extraout_var_00;
  SegmentBuilder *pSVar4;
  word *extraout_RDX;
  size_t extraout_RDX_00;
  word *result;
  AllocateResult AVar5;
  ArrayPtr<const_capnp::word> segment;
  ArrayPtr<capnp::word> content;
  undefined4 extraout_var;
  
  uVar1 = (ulong)amount;
  if ((this->segment0).super_SegmentReader.arena == (Arena *)0x0) {
    pSVar4 = &this->segment0;
    iVar3 = (*this->message->_vptr_MessageBuilder[2])(this->message,uVar1);
    this_00 = (_ *)CONCAT44(extraout_var,iVar3);
    segment.size_ = (size_t)extraout_RDX;
    segment.ptr = extraout_RDX;
    SVar2 = verifySegment(this_00,segment);
    (this->segment0).super_SegmentReader.arena = &this->super_Arena;
    (this->segment0).super_SegmentReader.id.value = 0;
    (this->segment0).super_SegmentReader.ptr.ptr = (word *)this_00;
    (this->segment0).super_SegmentReader.ptr.size_ = (ulong)SVar2;
    (this->segment0).super_SegmentReader.readLimiter = &this->dummyLimiter;
    (this->segment0).pos = (word *)this_00;
    (this->segment0).readOnly = false;
    this->segmentWithSpace = pSVar4;
    if (amount <= SVar2) {
      (this->segment0).pos = (word *)(this_00 + uVar1 * 8);
      goto LAB_00202736;
    }
  }
  else {
    pSVar4 = this->segmentWithSpace;
    if (((pSVar4 != (SegmentBuilder *)0x0) &&
        (this_00 = (_ *)pSVar4->pos,
        (long)uVar1 <=
        (long)((long)(pSVar4->super_SegmentReader).ptr.ptr +
              ((pSVar4->super_SegmentReader).ptr.size_ * 8 - (long)this_00)) >> 3)) &&
       (pSVar4->pos = (word *)(this_00 + uVar1 * 8), this_00 != (_ *)0x0)) {
      pSVar4 = this->segmentWithSpace;
      goto LAB_00202736;
    }
    iVar3 = (*this->message->_vptr_MessageBuilder[2])(this->message,uVar1);
    content.ptr._4_4_ = extraout_var_00;
    content.ptr._0_4_ = iVar3;
    content.size_ = extraout_RDX_00;
    pSVar4 = addSegmentInternal<capnp::word>(this,content);
    this->segmentWithSpace = pSVar4;
    this_00 = (_ *)pSVar4->pos;
    if ((long)uVar1 <=
        (long)((long)(pSVar4->super_SegmentReader).ptr.ptr +
              ((pSVar4->super_SegmentReader).ptr.size_ * 8 - (long)this_00)) >> 3) {
      pSVar4->pos = (word *)(this_00 + uVar1 * 8);
      goto LAB_00202736;
    }
  }
  this_00 = (_ *)0x0;
LAB_00202736:
  AVar5.words = (word *)this_00;
  AVar5.segment = pSVar4;
  return AVar5;
}

Assistant:

BuilderArena::AllocateResult BuilderArena::allocate(SegmentWordCount amount) {
  if (segment0.getArena() == nullptr) {
    // We're allocating the first segment.
    kj::ArrayPtr<word> ptr = message->allocateSegment(unbound(amount / WORDS));
    auto actualSize = verifySegment(ptr);

    // Re-allocate segment0 in-place.  This is a bit of a hack, but we have not returned any
    // pointers to this segment yet, so it should be fine.
    kj::dtor(segment0);
    kj::ctor(segment0, this, SegmentId(0), ptr.begin(), actualSize, &this->dummyLimiter);

    segmentWithSpace = &segment0;
    return AllocateResult { &segment0, segment0.allocate(amount) };
  } else {
    if (segmentWithSpace != nullptr) {
      // Check if there is space in an existing segment.
      // TODO(perf):  Check for available space in more than just the last segment.  We don't
      //   want this to be O(n), though, so we'll need to maintain some sort of table.  Complicating
      //   matters, we want SegmentBuilders::allocate() to be fast, so we can't update any such
      //   table when allocation actually happens.  Instead, we could have a priority queue based
      //   on the last-known available size, and then re-check the size when we pop segments off it
      //   and shove them to the back of the queue if they have become too small.
      word* attempt = segmentWithSpace->allocate(amount);
      if (attempt != nullptr) {
        return AllocateResult { segmentWithSpace, attempt };
      }
    }

    // Need to allocate a new segment.
    SegmentBuilder* result = addSegmentInternal(message->allocateSegment(unbound(amount / WORDS)));

    // Check this new segment first the next time we need to allocate.
    segmentWithSpace = result;

    // Allocating from the new segment is guaranteed to succeed since we made it big enough.
    return AllocateResult { result, result->allocate(amount) };
  }
}